

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void llvm::yaml::ScalarTraits<llvm::yaml::Hex8,_void>::output
               (Hex8 *Val,void *param_2,raw_ostream *Out)

{
  format_object_base local_20;
  uint8_t local_10;
  
  local_10 = Val->value;
  local_20.Fmt = "0x%02X";
  local_20._vptr_format_object_base = (_func_int **)&PTR_home_01098098;
  raw_ostream::operator<<(Out,&local_20);
  return;
}

Assistant:

void ScalarTraits<Hex8>::output(const Hex8 &Val, void *, raw_ostream &Out) {
  uint8_t Num = Val;
  Out << format("0x%02X", Num);
}